

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::SetWritable
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          BOOL value)

{
  BOOL BVar1;
  uint uVar2;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> local_40;
  int local_34 [2];
  BOOL isNumericPropertyId;
  
  if (propertyId == 0xd1) {
    SetLengthWritable(this,value != 0);
    uVar2 = 1;
    if ((value == 0) &&
       (((this->super_DictionaryTypeHandlerBase<int>).super_DynamicTypeHandler.flags & 0x20) != 0))
    {
      Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
      WriteBarrierSet(&local_40,
                      &((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       typesWithOnlyWritablePropertyProtoChain);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(local_40.ptr);
    }
  }
  else {
    BVar1 = UpdateAttribute(this,instance,propertyId,'\x04',value,local_34);
    if (BVar1 == 0) {
      uVar2 = 0;
      if (local_34[0] == 0) {
        BVar1 = DictionaryTypeHandlerBase<int>::SetWritable
                          (&this->super_DictionaryTypeHandlerBase<int>,instance,propertyId,value);
        uVar2 = (uint)(BVar1 != 0);
      }
    }
    else {
      uVar2 = 1;
    }
  }
  return uVar2;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        if (propertyId == PropertyIds::length)
        {
            SetLengthWritable(value ? true : false);
            if(!value && this->GetFlags() & this->IsPrototypeFlag)
            {
                instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
            }
            return true;
        }

        BOOL isNumericPropertyId;
        return UpdateAttribute(instance, propertyId, PropertyWritable, value, isNumericPropertyId)
            || (!isNumericPropertyId && __super::SetWritable(instance, propertyId, value));
    }